

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

DriveStrengthSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DriveStrengthSyntax,slang::syntax::DriveStrengthSyntax_const&>
          (BumpAllocator *this,DriveStrengthSyntax *args)

{
  undefined4 uVar1;
  DriveStrengthSyntax *pDVar2;
  long lVar3;
  DriveStrengthSyntax *pDVar4;
  byte bVar5;
  
  bVar5 = 0;
  pDVar2 = (DriveStrengthSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((DriveStrengthSyntax *)this->endPtr < pDVar2 + 1) {
    pDVar2 = (DriveStrengthSyntax *)allocateSlow(this,0x68,8);
  }
  else {
    this->head->current = (byte *)(pDVar2 + 1);
  }
  pDVar4 = pDVar2;
  for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
    uVar1 = *(undefined4 *)&(args->super_NetStrengthSyntax).super_SyntaxNode.field_0x4;
    (pDVar4->super_NetStrengthSyntax).super_SyntaxNode.kind =
         (args->super_NetStrengthSyntax).super_SyntaxNode.kind;
    *(undefined4 *)&(pDVar4->super_NetStrengthSyntax).super_SyntaxNode.field_0x4 = uVar1;
    args = (DriveStrengthSyntax *)((long)args + (ulong)bVar5 * -0x10 + 8);
    pDVar4 = (DriveStrengthSyntax *)((long)pDVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  return pDVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }